

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O1

shared_ptr<const_tchecker::typed_lvalue_expression_t> __thiscall
tchecker::typed_diagonal_clkconstr_expression_t::first_clock_ptr
          (typed_diagonal_clkconstr_expression_t *this)

{
  typed_expression_t *ptVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  typed_binary_expression_t *in_RSI;
  shared_ptr<const_tchecker::typed_expression_t> sVar4;
  undefined1 auVar5 [16];
  shared_ptr<const_tchecker::typed_lvalue_expression_t> sVar6;
  undefined1 local_20 [16];
  
  ptVar1 = typed_binary_expression_t::left_operand(in_RSI);
  lVar2 = __dynamic_cast(ptVar1,&typed_expression_t::typeinfo,&typed_binary_expression_t::typeinfo,0
                        );
  if (lVar2 != 0) {
    sVar4 = typed_binary_expression_t::left_operand_ptr((typed_binary_expression_t *)local_20);
    if (local_20._0_8_ == 0) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = sVar4.
                     super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi._M_pi;
      auVar5 = auVar5 << 0x40;
    }
    else {
      auVar5 = __dynamic_cast(local_20._0_8_,&typed_expression_t::typeinfo,
                              &typed_lvalue_expression_t::typeinfo,0);
    }
    _Var3._M_pi = auVar5._8_8_;
    if (auVar5._0_8_ == 0) {
      *(undefined8 *)&(this->super_typed_binary_expression_t).super_typed_expression_t = 0;
      *(undefined8 *)&(this->super_typed_binary_expression_t).super_typed_expression_t._type = 0;
    }
    else {
      *(long *)&(this->super_typed_binary_expression_t).super_typed_expression_t = auVar5._0_8_;
      *(undefined8 *)&(this->super_typed_binary_expression_t).super_typed_expression_t._type =
           local_20._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_20._8_8_ + 8) = *(_Atomic_word *)(local_20._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_20._8_8_ + 8) = *(_Atomic_word *)(local_20._8_8_ + 8) + 1;
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_);
      _Var3._M_pi = extraout_RDX;
    }
    sVar6.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    sVar6.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (shared_ptr<const_tchecker::typed_lvalue_expression_t>)
           sVar6.
           super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __cxa_bad_cast();
}

Assistant:

std::shared_ptr<tchecker::typed_lvalue_expression_t const> typed_diagonal_clkconstr_expression_t::first_clock_ptr() const
{
  auto const & diagonal = dynamic_cast<tchecker::typed_binary_expression_t const &>(left_operand()); // left expr is x - y
  return std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(diagonal.left_operand_ptr());
}